

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O0

void __thiscall icu_63::SpoofImpl::~SpoofImpl(SpoofImpl *this)

{
  UnicodeSet *this_00;
  void *in_RSI;
  SpoofImpl *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__SpoofImpl_004ec840;
  this->fMagic = 0;
  if (this->fSpoofData != (SpoofData *)0x0) {
    SpoofData::removeReference(this->fSpoofData);
  }
  this_00 = this->fAllowedCharsSet;
  if (this_00 != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet(this_00);
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
  }
  uprv_free_63(this->fAllowedLocales);
  UObject::~UObject(&this->super_UObject);
  return;
}

Assistant:

SpoofImpl::~SpoofImpl() {
    fMagic = 0;                // head off application errors by preventing use of
                               //    of deleted objects.
    if (fSpoofData != NULL) {
        fSpoofData->removeReference();   // Will delete if refCount goes to zero.
    }
    delete fAllowedCharsSet;
    uprv_free((void *)fAllowedLocales);
}